

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::ErrorsUtilities::CheckErrorAndLog
          (ErrorsUtilities *this,Context *context,GLuint expected_error,GLchar *function_name,
          GLchar *log)

{
  int iVar1;
  GLuint GVar2;
  undefined4 extraout_var;
  size_t sVar3;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  ios_base local_130 [264];
  
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected_error) {
    local_1a8 = (undefined1  [8])context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    iVar1 = (int)(ostringstream *)&local_1a0;
    if (function_name == (GLchar *)0x0) {
      std::ios::clear(iVar1 + (int)local_1a0[-3]);
    }
    else {
      sVar3 = strlen(function_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,function_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0," generated error ",0x11);
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," but, ",6);
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0," was expected if ",0x11);
    if (log == (GLchar *)0x0) {
      std::ios::clear(iVar1 + (int)local_1a0[-3]);
    }
    else {
      sVar3 = strlen(log);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,log,sVar3);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return GVar2 == expected_error;
}

Assistant:

bool ErrorsUtilities::CheckErrorAndLog(deqp::Context& context, glw::GLuint expected_error,
									   const glw::GLchar* function_name, const glw::GLchar* log)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Check error. */
	glw::GLenum error = GL_NO_ERROR;

	if (expected_error != (error = gl.getError()))
	{
		context.getTestContext().getLog() << tcu::TestLog::Message << function_name << " generated error "
										  << glu::getErrorStr(error) << " but, " << glu::getErrorStr(expected_error)
										  << " was expected if " << log << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}